

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O3

example * __thiscall VW::ptr_queue<example>::pop(ptr_queue<example> *this)

{
  _Map_pointer pppeVar1;
  _Elt_pointer ppeVar2;
  example *peVar3;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device = &this->mut;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  if (this->done == false) {
    do {
      pppeVar1 = (this->object_queue).c.super__Deque_base<example_*,_std::allocator<example_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node;
      ppeVar2 = (this->object_queue).c.super__Deque_base<example_*,_std::allocator<example_*>_>.
                _M_impl.super__Deque_impl_data._M_start._M_cur;
      if (((long)(this->object_queue).c.super__Deque_base<example_*,_std::allocator<example_*>_>.
                 _M_impl.super__Deque_impl_data._M_start._M_last - (long)ppeVar2 >> 3) +
          ((long)(this->object_queue).c.super__Deque_base<example_*,_std::allocator<example_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_cur -
           (long)(this->object_queue).c.super__Deque_base<example_*,_std::allocator<example_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
          ((((ulong)((long)pppeVar1 -
                    (long)(this->object_queue).c.
                          super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
                          super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
          (ulong)(pppeVar1 == (_Map_pointer)0x0)) * 0x40 != 0) goto LAB_001b310a;
      std::condition_variable::wait((unique_lock *)&this->is_not_empty);
    } while (this->done != true);
  }
  pppeVar1 = (this->object_queue).c.super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl
             .super__Deque_impl_data._M_finish._M_node;
  ppeVar2 = (this->object_queue).c.super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  if (((long)(this->object_queue).c.super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl
             .super__Deque_impl_data._M_start._M_last - (long)ppeVar2 >> 3) +
      ((long)(this->object_queue).c.super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl
             .super__Deque_impl_data._M_finish._M_cur -
       (long)(this->object_queue).c.super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl
             .super__Deque_impl_data._M_finish._M_first >> 3) +
      ((((ulong)((long)pppeVar1 -
                (long)(this->object_queue).c.
                      super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
                      super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
      (ulong)(pppeVar1 == (_Map_pointer)0x0)) * 0x40 == 0) {
    peVar3 = (example *)0x0;
  }
  else {
LAB_001b310a:
    peVar3 = *ppeVar2;
    std::deque<example_*,_std::allocator<example_*>_>::pop_front(&(this->object_queue).c);
    std::unique_lock<std::mutex>::unlock(&local_28);
    std::condition_variable::notify_all();
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return peVar3;
}

Assistant:

T* pop()
    {
      std::unique_lock<std::mutex> lock(mut);
      while (!done && object_queue.size() == 0)
      {
        is_not_empty.wait(lock);
      }

      if (done && object_queue.size() == 0)
      {
        return nullptr;
      }

      auto item = object_queue.front();
      object_queue.pop();

      lock.unlock();
      is_not_full.notify_all();
      return item;
    }